

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_prediction_degree_traverser.h
# Opt level: O0

bool __thiscall
draco::
MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
::TraverseFromCorner
          (MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           *this,CornerIndex corner_id)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  CornerTable *pCVar6;
  MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  *this_00;
  ThisIndexType *this_01;
  MeshAttributeIndicesEncodingObserver<draco::CornerTable> *this_02;
  uint in_ESI;
  TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  *in_RDI;
  int priority_1;
  int priority;
  bool is_left_face_visited;
  bool is_right_face_visited;
  FaceIndex left_face_id;
  FaceIndex right_face_id;
  CornerIndex left_corner_id;
  CornerIndex right_corner_id;
  VertexIndex vert_id;
  FaceIndex face_id;
  VertexIndex tip_vertex;
  VertexIndex prev_vert;
  VertexIndex next_vert;
  TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  *in_stack_fffffffffffffef8;
  MeshAttributeIndicesEncodingObserver<draco::CornerTable> *in_stack_ffffffffffffff00;
  MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  *in_stack_ffffffffffffff08;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *in_stack_ffffffffffffff10;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> in_stack_ffffffffffffff28;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> in_stack_ffffffffffffff2c;
  CornerIndex in_stack_ffffffffffffff30;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> in_stack_ffffffffffffff34;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_b0;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_ac;
  uint local_a8;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_a4;
  uint local_a0;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_78;
  uint local_74;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_70;
  ThisIndexType local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_8 [2];
  
  local_8[0].value_ = in_ESI;
  sVar5 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::size
                    ((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                      *)0x18130f);
  if (sVar5 != 0) {
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::push_back(in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
    in_RDI[1].is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    pCVar6 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ::corner_table(in_RDI);
    TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
    ::corner_table(in_RDI);
    local_1c = local_8[0].value_;
    local_18 = (uint)CornerTable::Next((CornerTable *)in_stack_ffffffffffffff08,
                                       (CornerIndex)(uint)pCVar6);
    local_14 = (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                         (CornerIndex)(uint)pCVar6);
    this_00 = (MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               *)TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ::corner_table(in_RDI);
    TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
    ::corner_table(in_RDI);
    local_28 = local_8[0].value_;
    local_24 = (uint)CornerTable::Previous
                               ((CornerTable *)in_stack_ffffffffffffff08,(CornerIndex)(uint)pCVar6);
    local_20 = (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                         (CornerIndex)(uint)pCVar6);
    local_2c = local_14;
    bVar1 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            ::IsVertexVisited(in_stack_fffffffffffffef8,
                              (VertexIndex)(uint)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    if (!bVar1) {
      local_30 = local_14;
      TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
      ::MarkVertexVisited(&in_stack_ffffffffffffff08->
                           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                          ,(VertexIndex)(uint)((ulong)pCVar6 >> 0x20));
      in_stack_ffffffffffffff08 =
           (MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            *)TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ::traversal_observer(in_RDI);
      local_34 = local_14;
      TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
      ::corner_table(in_RDI);
      local_3c = local_8[0].value_;
      local_38 = (uint)CornerTable::Next((CornerTable *)in_stack_ffffffffffffff08,
                                         (CornerIndex)(uint)pCVar6);
      MeshAttributeIndicesEncodingObserver<draco::CornerTable>::OnNewVertexVisited
                ((MeshAttributeIndicesEncodingObserver<draco::CornerTable> *)
                 CONCAT44(in_stack_ffffffffffffff2c.value_,in_stack_ffffffffffffff28.value_),
                 (VertexIndex)in_stack_ffffffffffffff34.value_,in_stack_ffffffffffffff30);
    }
    local_40 = local_20;
    bVar1 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            ::IsVertexVisited(in_stack_fffffffffffffef8,
                              (VertexIndex)(uint)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    if (!bVar1) {
      local_44 = local_20;
      TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
      ::MarkVertexVisited(&in_stack_ffffffffffffff08->
                           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                          ,(VertexIndex)(uint)((ulong)pCVar6 >> 0x20));
      in_stack_ffffffffffffff00 =
           TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           ::traversal_observer(in_RDI);
      local_48 = local_20;
      TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
      ::corner_table(in_RDI);
      local_50 = local_8[0].value_;
      local_4c = (uint)CornerTable::Previous
                                 ((CornerTable *)in_stack_ffffffffffffff08,(CornerIndex)(uint)pCVar6
                                 );
      MeshAttributeIndicesEncodingObserver<draco::CornerTable>::OnNewVertexVisited
                ((MeshAttributeIndicesEncodingObserver<draco::CornerTable> *)
                 CONCAT44(in_stack_ffffffffffffff2c.value_,in_stack_ffffffffffffff28.value_),
                 (VertexIndex)in_stack_ffffffffffffff34.value_,in_stack_ffffffffffffff30);
    }
    TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
    ::corner_table(in_RDI);
    local_58 = local_8[0].value_;
    local_5c = (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                         (CornerIndex)(uint)pCVar6);
    local_54 = local_5c;
    bVar1 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            ::IsVertexVisited(in_stack_fffffffffffffef8,
                              (VertexIndex)(uint)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    if (!bVar1) {
      local_60 = local_54;
      TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
      ::MarkVertexVisited(&in_stack_ffffffffffffff08->
                           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                          ,(VertexIndex)(uint)((ulong)pCVar6 >> 0x20));
      TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
      ::traversal_observer(in_RDI);
      local_64 = local_54;
      local_68 = local_8[0].value_;
      MeshAttributeIndicesEncodingObserver<draco::CornerTable>::OnNewVertexVisited
                ((MeshAttributeIndicesEncodingObserver<draco::CornerTable> *)
                 CONCAT44(in_stack_ffffffffffffff2c.value_,in_stack_ffffffffffffff28.value_),
                 (VertexIndex)in_stack_ffffffffffffff34.value_,in_stack_ffffffffffffff30);
    }
LAB_001815ef:
    local_6c.value_ = (uint)PopNextCornerToTraverse(in_stack_ffffffffffffff08);
    this_01 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(local_8,&local_6c);
    bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                      (this_01,(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                               &kInvalidCornerIndex);
    if (bVar1) {
      uVar3 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(local_8);
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_70,uVar3 / 3);
      local_74 = local_70.value_;
      bVar1 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ::IsFaceVisited(&in_stack_ffffffffffffff08->
                               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                              ,(FaceIndex)(uint)pCVar6);
      if (!bVar1) {
LAB_0018167e:
        while( true ) {
          uVar3 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(local_8);
          IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_78,uVar3 / 3);
          IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator=(&local_70,&local_78);
          local_7c = local_70.value_;
          TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
          ::MarkFaceVisited(&in_stack_ffffffffffffff08->
                             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                            ,(FaceIndex)(uint)((ulong)pCVar6 >> 0x20));
          this_02 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                    ::traversal_observer(in_RDI);
          local_80 = local_70.value_;
          MeshAttributeIndicesEncodingObserver<draco::CornerTable>::OnNewFaceVisited
                    (this_02,(FaceIndex)local_70.value_);
          TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
          ::corner_table(in_RDI);
          local_88 = local_8[0].value_;
          local_8c = (uint)CornerTable::Vertex((CornerTable *)in_stack_ffffffffffffff08,
                                               (CornerIndex)(uint)pCVar6);
          local_84 = local_8c;
          bVar1 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  ::IsVertexVisited(in_stack_fffffffffffffef8,
                                    (VertexIndex)(uint)((ulong)in_stack_ffffffffffffff00 >> 0x20));
          if (!bVar1) {
            local_90 = local_84;
            TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            ::MarkVertexVisited(&in_stack_ffffffffffffff08->
                                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                                ,(VertexIndex)(uint)((ulong)pCVar6 >> 0x20));
            TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            ::traversal_observer(in_RDI);
            local_94 = local_84;
            local_98 = local_8[0].value_;
            MeshAttributeIndicesEncodingObserver<draco::CornerTable>::OnNewVertexVisited
                      ((MeshAttributeIndicesEncodingObserver<draco::CornerTable> *)
                       CONCAT44(in_stack_ffffffffffffff2c.value_,in_stack_ffffffffffffff28.value_),
                       (VertexIndex)in_stack_ffffffffffffff34.value_,in_stack_ffffffffffffff30);
          }
          TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
          ::corner_table(in_RDI);
          local_a0 = local_8[0].value_;
          local_9c.value_ =
               (uint)CornerTable::GetRightCorner
                               ((CornerTable *)in_stack_ffffffffffffff08,(uint)pCVar6);
          TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
          ::corner_table(in_RDI);
          local_a8 = local_8[0].value_;
          local_a4.value_ =
               (uint)CornerTable::GetLeftCorner
                               ((CornerTable *)in_stack_ffffffffffffff08,(uint)pCVar6);
          bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                            (&local_9c,
                             (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                             &kInvalidCornerIndex);
          if (bVar1) {
            local_ac.value_ = 0xffffffff;
          }
          else {
            uVar3 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_9c);
            IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_ac,uVar3 / 3);
          }
          bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                            (&local_a4,
                             (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                             &kInvalidCornerIndex);
          if (bVar1) {
            local_b0.value_ = 0xffffffff;
          }
          else {
            uVar3 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_a4);
            IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_b0,uVar3 / 3);
          }
          bVar1 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  ::IsFaceVisited(&in_stack_ffffffffffffff08->
                                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                                  ,(FaceIndex)(uint)pCVar6);
          bVar2 = TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  ::IsFaceVisited(&in_stack_ffffffffffffff08->
                                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                                  ,(FaceIndex)(uint)pCVar6);
          if (bVar2) break;
          iVar4 = ComputePriority(this_00,(CornerIndex)(uint)((ulong)in_RDI >> 0x20));
          if ((!bVar1) ||
             ((int)in_RDI[1].is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset < iVar4)) {
            in_stack_ffffffffffffff34.value_ = local_a4.value_;
            AddCornerToTraversalStack
                      (in_stack_ffffffffffffff08,(CornerIndex)(uint)((ulong)pCVar6 >> 0x20),
                       (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
            break;
          }
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(local_8,&local_a4);
        }
        if (bVar1) goto LAB_001815ef;
        in_stack_ffffffffffffff2c.value_ = local_9c.value_;
        in_stack_ffffffffffffff30.value_ = ComputePriority(this_00,(uint)((ulong)in_RDI >> 0x20));
        if ((int)in_stack_ffffffffffffff30.value_ <=
            (int)in_RDI[1].is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) {
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(local_8,&local_9c);
          goto LAB_0018167e;
        }
        in_stack_ffffffffffffff28.value_ = local_9c.value_;
        AddCornerToTraversalStack
                  (in_stack_ffffffffffffff08,(CornerIndex)(uint)((ulong)pCVar6 >> 0x20),
                   (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      }
      goto LAB_001815ef;
    }
  }
  return true;
}

Assistant:

bool TraverseFromCorner(CornerIndex corner_id) {
    if (prediction_degree_.size() == 0) {
      return true;
    }

    // Traversal starts from the |corner_id|. It's going to follow either the
    // right or the left neighboring faces to |corner_id| based on their
    // prediction degree.
    traversal_stacks_[0].push_back(corner_id);
    best_priority_ = 0;
    // For the first face, check the remaining corners as they may not be
    // processed yet.
    const VertexIndex next_vert =
        this->corner_table()->Vertex(this->corner_table()->Next(corner_id));
    const VertexIndex prev_vert =
        this->corner_table()->Vertex(this->corner_table()->Previous(corner_id));
    if (!this->IsVertexVisited(next_vert)) {
      this->MarkVertexVisited(next_vert);
      this->traversal_observer().OnNewVertexVisited(
          next_vert, this->corner_table()->Next(corner_id));
    }
    if (!this->IsVertexVisited(prev_vert)) {
      this->MarkVertexVisited(prev_vert);
      this->traversal_observer().OnNewVertexVisited(
          prev_vert, this->corner_table()->Previous(corner_id));
    }
    const VertexIndex tip_vertex = this->corner_table()->Vertex(corner_id);
    if (!this->IsVertexVisited(tip_vertex)) {
      this->MarkVertexVisited(tip_vertex);
      this->traversal_observer().OnNewVertexVisited(tip_vertex, corner_id);
    }
    // Start the actual traversal.
    while ((corner_id = PopNextCornerToTraverse()) != kInvalidCornerIndex) {
      FaceIndex face_id(corner_id.value() / 3);
      // Make sure the face hasn't been visited yet.
      if (this->IsFaceVisited(face_id)) {
        // This face has been already traversed.
        continue;
      }

      while (true) {
        face_id = FaceIndex(corner_id.value() / 3);
        this->MarkFaceVisited(face_id);
        this->traversal_observer().OnNewFaceVisited(face_id);

        // If the newly reached vertex hasn't been visited, mark it and notify
        // the observer.
        const VertexIndex vert_id = this->corner_table()->Vertex(corner_id);
        if (!this->IsVertexVisited(vert_id)) {
          this->MarkVertexVisited(vert_id);
          this->traversal_observer().OnNewVertexVisited(vert_id, corner_id);
        }

        // Check whether we can traverse to the right and left neighboring
        // faces.
        const CornerIndex right_corner_id =
            this->corner_table()->GetRightCorner(corner_id);
        const CornerIndex left_corner_id =
            this->corner_table()->GetLeftCorner(corner_id);
        const FaceIndex right_face_id(
            (right_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(right_corner_id.value() / 3)));
        const FaceIndex left_face_id(
            (left_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(left_corner_id.value() / 3)));
        const bool is_right_face_visited = this->IsFaceVisited(right_face_id);
        const bool is_left_face_visited = this->IsFaceVisited(left_face_id);

        if (!is_left_face_visited) {
          // We can go to the left face.
          const int priority = ComputePriority(left_corner_id);
          if (is_right_face_visited && priority <= best_priority_) {
            // Right face has been already visited and the priority is equal or
            // better than the best priority. We are sure that the left face
            // would be traversed next so there is no need to put it onto the
            // stack.
            corner_id = left_corner_id;
            continue;
          } else {
            AddCornerToTraversalStack(left_corner_id, priority);
          }
        }
        if (!is_right_face_visited) {
          // Go to the right face.
          const int priority = ComputePriority(right_corner_id);
          if (priority <= best_priority_) {
            // We are sure that the right face would be traversed next so there
            // is no need to put it onto the stack.
            corner_id = right_corner_id;
            continue;
          } else {
            AddCornerToTraversalStack(right_corner_id, priority);
          }
        }

        // Couldn't proceed directly to the next corner
        break;
      }
    }
    return true;
  }